

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *pTVar1;
  UnitTestImpl *impl;
  ScopedFakeTestPartResultReporter *this_local;
  
  this_00 = testing::internal::GetUnitTestImpl();
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    pTVar1 = testing::internal::UnitTestImpl::GetGlobalTestPartResultReporter(this_00);
    this->old_reporter_ = pTVar1;
    testing::internal::UnitTestImpl::SetGlobalTestPartResultReporter
              (this_00,&this->super_TestPartResultReporterInterface);
  }
  else {
    pTVar1 = testing::internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this_00);
    this->old_reporter_ = pTVar1;
    testing::internal::UnitTestImpl::SetTestPartResultReporterForCurrentThread
              (this_00,&this->super_TestPartResultReporterInterface);
  }
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}